

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

MatchMatrix * __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<std::vector<std::pair<int,phmap::priv::NonStandardLayout>,std::allocator<std::pair<int,phmap::priv::NonStandardLayout>>>const&>
::
AnalyzeElements<__gnu_cxx::__normal_iterator<std::pair<int,phmap::priv::NonStandardLayout>const*,std::vector<std::pair<int,phmap::priv::NonStandardLayout>,std::allocator<std::pair<int,phmap::priv::NonStandardLayout>>>>>
          (MatchMatrix *__return_storage_ptr__,
          UnorderedElementsAreMatcherImpl<std::vector<std::pair<int,phmap::priv::NonStandardLayout>,std::allocator<std::pair<int,phmap::priv::NonStandardLayout>>>const&>
          *this,__normal_iterator<const_std::pair<int,_phmap::priv::NonStandardLayout>_*,_std::vector<std::pair<int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<int,_phmap::priv::NonStandardLayout>_>_>_>
                elem_first,
          __normal_iterator<const_std::pair<int,_phmap::priv::NonStandardLayout>_*,_std::vector<std::pair<int,_phmap::priv::NonStandardLayout>,_std::allocator<std::pair<int,_phmap::priv::NonStandardLayout>_>_>_>
          elem_last,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchResultListener *listener)

{
  long lVar1;
  pointer pcVar2;
  pair<int,_phmap::priv::NonStandardLayout> *extraout_RDX;
  pair<int,_phmap::priv::NonStandardLayout> *value;
  long lVar3;
  size_t sVar4;
  size_t irhs;
  long lVar5;
  size_t num_elements;
  vector<char,_std::allocator<char>_> did_match;
  DummyMatchResultListener dummy;
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(element_printouts);
  did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dummy.super_MatchResultListener.stream_ = (ostream *)0x0;
  dummy.super_MatchResultListener._vptr_MatchResultListener =
       (_func_int **)&PTR__MatchResultListener_002d3bf8;
  num_elements = 0;
  value = extraout_RDX;
  for (; elem_first._M_current != elem_last._M_current;
      elem_first._M_current = elem_first._M_current + 1) {
    if (listener->stream_ != (ostream *)0x0) {
      PrintToString<std::pair<int,phmap::priv::NonStandardLayout>>
                (&local_50,(testing *)elem_first._M_current,value);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 element_printouts,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    lVar3 = 0;
    lVar5 = 0;
    while( true ) {
      lVar1 = *(long *)(this + 0x30) - *(long *)(this + 0x28);
      value = (pair<int,_phmap::priv::NonStandardLayout> *)(lVar1 % 0x18);
      if (lVar5 == lVar1 / 0x18) break;
      local_50._M_dataplus._M_p._0_1_ =
           MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>::MatchAndExplain
                     ((MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *)
                      (*(long *)(this + 0x28) + lVar3),elem_first._M_current,
                      &dummy.super_MatchResultListener);
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(&did_match,(char *)&local_50);
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0x18;
    }
    num_elements = num_elements + 1;
  }
  MatchMatrix::MatchMatrix
            (__return_storage_ptr__,num_elements,
             (*(long *)(this + 0x30) - *(long *)(this + 0x28)) / 0x18);
  pcVar2 = did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start;
  for (sVar4 = 0; sVar4 != num_elements; sVar4 = sVar4 + 1) {
    for (lVar3 = 0; lVar3 != (*(long *)(this + 0x30) - *(long *)(this + 0x28)) / 0x18;
        lVar3 = lVar3 + 1) {
      (__return_storage_ptr__->matched_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar3 + __return_storage_ptr__->num_matchers_ * sVar4] =
           pcVar2[lVar3] != '\0';
    }
    pcVar2 = pcVar2 + lVar3;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&did_match.super__Vector_base<char,_std::allocator<char>_>);
  return __return_storage_ptr__;
}

Assistant:

MatchMatrix AnalyzeElements(ElementIter elem_first, ElementIter elem_last,
                              ::std::vector<std::string>* element_printouts,
                              MatchResultListener* listener) const {
    element_printouts->clear();
    ::std::vector<char> did_match;
    size_t num_elements = 0;
    DummyMatchResultListener dummy;
    for (; elem_first != elem_last; ++num_elements, ++elem_first) {
      if (listener->IsInterested()) {
        element_printouts->push_back(PrintToString(*elem_first));
      }
      for (size_t irhs = 0; irhs != matchers_.size(); ++irhs) {
        did_match.push_back(
            matchers_[irhs].MatchAndExplain(*elem_first, &dummy));
      }
    }

    MatchMatrix matrix(num_elements, matchers_.size());
    ::std::vector<char>::const_iterator did_match_iter = did_match.begin();
    for (size_t ilhs = 0; ilhs != num_elements; ++ilhs) {
      for (size_t irhs = 0; irhs != matchers_.size(); ++irhs) {
        matrix.SetEdge(ilhs, irhs, *did_match_iter++ != 0);
      }
    }
    return matrix;
  }